

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satsolver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Result RVar1;
  GetOpt_pp *pGVar2;
  ostream *poVar3;
  expression *a;
  long lVar4;
  int iVar5;
  char *pcVar6;
  bool terminal_flag;
  int mode;
  string output_file_string;
  string input_file_string;
  GetOpt_pp optparser;
  bool local_27d;
  int local_27c;
  _Option local_278;
  undefined1 local_270;
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  bool *local_248;
  string local_240;
  string local_220;
  _Option local_200;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  _func_int *local_1f0 [2];
  undefined1 local_1e0 [16];
  string *local_1d0;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  _Option local_148;
  undefined1 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  string *local_118;
  _Option local_110;
  undefined1 local_108;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  int *local_e0;
  GetOpt_pp local_d8;
  
  GetOpt::GetOpt_pp::GetOpt_pp(&local_d8,argc,argv);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"input.txt","");
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"output.txt","");
  local_27c = 0;
  local_200._vptr__Option = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"help","");
  local_278._vptr__Option = (_func_int **)&PTR_operator___00112a78;
  local_270 = 0x68;
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_268,local_200._vptr__Option,
             CONCAT71(uStack_1f7,local_1f8) + (long)local_200._vptr__Option);
  local_248 = (bool *)0x0;
  pGVar2 = GetOpt::GetOpt_pp::operator>>(&local_d8,&local_278);
  RVar1 = pGVar2->_last;
  local_278._vptr__Option = (_func_int **)&PTR_operator___00112a78;
  if (local_268[0] != local_258) {
    operator_delete(local_268[0]);
  }
  if (local_200._vptr__Option != local_1f0) {
    operator_delete(local_200._vptr__Option);
  }
  if (RVar1 == OK) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,help_string_abi_cxx11_._M_dataplus._M_p,
               help_string_abi_cxx11_._M_string_length);
    goto LAB_00103e7e;
  }
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"terminal","");
  local_278._vptr__Option = (_func_int **)&PTR_operator___00112a78;
  local_270 = 0x74;
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char*>((string *)local_268,local_1a8,local_1a8 + local_1a0);
  local_248 = &local_27d;
  pGVar2 = GetOpt::GetOpt_pp::operator>>(&local_d8,&local_278);
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"input","");
  local_200._vptr__Option = (_func_int **)&PTR_operator___00112b10;
  local_1f8 = 0x69;
  local_1f0[0] = (_func_int *)local_1e0;
  std::__cxx11::string::_M_construct<char*>((string *)local_1f0,local_168,local_168 + local_160);
  local_200._vptr__Option = (_func_int **)&PTR_operator___00112b58;
  local_1d0 = &local_220;
  pGVar2 = GetOpt::GetOpt_pp::operator>>(pGVar2,&local_200);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"output","");
  local_148._vptr__Option = (_func_int **)&PTR_operator___00112b10;
  local_140 = 0x6f;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char*>((string *)local_138,local_1c8,local_1c8 + local_1c0);
  local_148._vptr__Option = (_func_int **)&PTR_operator___00112b58;
  local_118 = &local_240;
  pGVar2 = GetOpt::GetOpt_pp::operator>>(pGVar2,&local_148);
  local_188 = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"mode","");
  local_110._vptr__Option = (_func_int **)&PTR_operator___00112ac8;
  local_108 = 0x6d;
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char*>((string *)local_100,local_188,local_188 + local_180);
  local_e0 = &local_27c;
  local_110._vptr__Option = (_func_int **)&PTR_operator___00112ba0;
  GetOpt::GetOpt_pp::operator>>(pGVar2,&local_110);
  local_110._vptr__Option = (_func_int **)&PTR_operator___00112ac8;
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0]);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  local_148._vptr__Option = (_func_int **)&PTR_operator___00112b10;
  if (local_138[0] != local_128) {
    operator_delete(local_138[0]);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  local_200._vptr__Option = (_func_int **)&PTR_operator___00112b10;
  if (local_1f0[0] != (_func_int *)local_1e0) {
    operator_delete(local_1f0[0]);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  local_278._vptr__Option = (_func_int **)&PTR_operator___00112a78;
  if (local_268[0] != local_258) {
    operator_delete(local_268[0]);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Terminal Mode: ",0xf);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Input File String: ",0x13);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Output File String: ",0x14);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Mode: ",6);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_27c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::istream::get();
  a = read_exp_from_file(&local_220);
  if (a == (expression *)0x0) {
    lVar4 = 0x27;
    pcVar6 = "Had problems reading input expression!\n";
    goto LAB_00103e8e;
  }
  switch(local_27c) {
  case 0:
    lVar4 = 0x1f;
    pcVar6 = "Satisfyability Not Implemented\n";
    goto LAB_00103e3e;
  case 1:
    CNF_FORM(a);
    break;
  case 2:
    DNF_FORM(a);
    break;
  case 3:
    reduce_associative(a);
    break;
  case 4:
    break;
  case 5:
    negated_standard(a);
    break;
  case 6:
    dual_standard(a);
    break;
  case 7:
    standard_form_raw(a);
    break;
  case 8:
    standard_form(a);
    break;
  case 9:
    lVar4 = 0x18;
    pcVar6 = "NANDIFY Not Implemented\n";
    goto LAB_00103e3e;
  case 10:
    lVar4 = 0x17;
    pcVar6 = "NORIFY Not Implemented\n";
LAB_00103e3e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
    lVar4 = 0x29;
    pcVar6 = "Had problems creating output expression!\n";
LAB_00103e8e:
    iVar5 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
    goto LAB_00103e9f;
  default:
    lVar4 = 0x35;
    pcVar6 = "Invalid Mode! Use -h or --help for more information!\n";
    goto LAB_00103e8e;
  }
  write_exp_to_file(a,&local_240,local_27d);
  std::istream::get();
LAB_00103e7e:
  iVar5 = 0;
LAB_00103e9f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  GetOpt::GetOpt_pp::TokensDeleter::~TokensDeleter(&local_d8._tokens_deleter);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._app_name._M_dataplus._M_p != &local_d8._app_name.field_2) {
    operator_delete(local_d8._app_name._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
  ::~_Rb_tree(&local_d8._longOps._M_t);
  std::
  _Rb_tree<char,_std::pair<const_char,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_char,_GetOpt::OptionData>_>,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
  ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_char,_GetOpt::OptionData>_>,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
               *)&local_d8);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]){

	GetOpt::GetOpt_pp optparser(argc, argv);
	std::string input_file_string = "input.txt",
		output_file_string = "output.txt";
	bool terminal_flag;
	int mode = 0;

	// If the help flag is set, then we don't actually do any work!
	if (optparser >> GetOpt::OptionPresent('h', "help")) {
		std::cout << help_string;
		return 0;
	}

	// Not providing the option should leave input file strings alone
	// Gonna do some testing now
	optparser >> GetOpt::OptionPresent('t', "terminal", terminal_flag)
		>> GetOpt::Option('i', "input", input_file_string)
		>> GetOpt::Option('o', "output", output_file_string)
		>> GetOpt::Option('m', "mode", mode);

#ifdef DEBUG_INPUT_PARSE
	std::cout << "Terminal Mode: " << terminal_flag << "\n"
		<< "Input File String: " << input_file_string << "\n"
		<< "Output File String: " << output_file_string << "\n"
		<< "Mode: " << mode << "\n";
	std::cin.get();
#endif // DEBUG_INPUT_PARSE

	// Read in from the input file
	expression* in_exp = read_exp_from_file(input_file_string);
	expression* out_exp = NULL;
	
	if (in_exp == NULL) {
		std::cout << "Had problems reading input expression!\n";
		return 1;
	}

	/*
		Convert the input expression into an output expression,
		These are all implemented in satform
	*/
	switch (mode) {
	case 0:
		std::cout << "Satisfyability Not Implemented\n";
		break;
	case 1:
		CNF_FORM(in_exp);
		out_exp = in_exp;
		break;
	case 2:
		DNF_FORM(in_exp);
		out_exp = in_exp;
		break;
	case 3:
		reduce_associative(in_exp);
		out_exp = in_exp;
		break;
	case 4:
		out_exp = in_exp;
		break;
	case 5:
		negated_standard(in_exp);
		out_exp = in_exp;
		break;
	case 6:
		dual_standard(in_exp);
		out_exp = in_exp;
		break;
	case 7:
		standard_form_raw(in_exp);
		out_exp = in_exp;
		break;
	case 8:
		standard_form(in_exp);
		out_exp = in_exp;
		break;
	case 9:
		std::cout << "NANDIFY Not Implemented\n";
		break;
	case 10:
		std::cout << "NORIFY Not Implemented\n"; 
		break;
	default:
		std::cout << "Invalid Mode! Use -h or --help for more information!\n";
		return 1;
	}

	if (out_exp == NULL) {
		std::cout << "Had problems creating output expression!\n";
		return 1;
	}

	write_exp_to_file(out_exp, output_file_string, terminal_flag);

	std::cin.get();
	return 0;
}